

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall TextEntry::draw(TextEntry *this)

{
  uint uVar1;
  ALLEGRO_FONT *pAVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ALLEGRO_USTR *pAVar8;
  ulong uVar9;
  ALLEGRO_USTR *pAVar10;
  long *in_RDI;
  float fVar11;
  float fVar12;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int subw;
  UString sub_1;
  int post_cursor;
  UString sub;
  int x;
  ALLEGRO_COLOR bg;
  SaveState state;
  Theme *theme;
  int in_stack_fffffffffffff9bc;
  SaveState *in_stack_fffffffffffff9c0;
  ALLEGRO_USTR *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  UString local_540 [24];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4ec;
  UString local_4e8 [28];
  undefined4 local_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  UString local_4a0 [28];
  int local_484;
  UString local_480 [24];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_444;
  undefined8 local_428;
  undefined8 uStack_420;
  Theme *local_10;
  
  local_10 = Dialog::get_theme((Dialog *)in_RDI[3]);
  anon_unknown.dwarf_8f94::SaveState::SaveState(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc)
  ;
  local_428._0_4_ = (local_10->bg).r;
  local_428._4_4_ = (local_10->bg).g;
  uStack_420._0_4_ = (local_10->bg).b;
  uStack_420._4_4_ = (local_10->bg).a;
  bVar4 = (**(code **)(*in_RDI + 0x80))();
  if ((bVar4 & 1) != 0) {
    local_444 = al_map_rgb(0x40,0x40);
    uStack_420 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
    local_428 = local_444;
  }
  local_458 = local_428;
  uStack_450 = uStack_420;
  al_draw_filled_rectangle
            ((float)(int)in_RDI[4],(float)*(int *)((long)in_RDI + 0x24),(float)(int)in_RDI[5],
             (float)*(int *)((long)in_RDI + 0x2c),(int)local_428,uStack_420);
  al_set_blender(0,1,3);
  iVar5 = (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20);
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    pAVar2 = local_10->font;
    local_468._0_4_ = (local_10->fg).r;
    local_468._4_4_ = (local_10->fg).g;
    uStack_460._0_4_ = (local_10->fg).b;
    uStack_460._4_4_ = (local_10->fg).a;
    lVar3 = in_RDI[4];
    iVar6 = *(int *)((long)in_RDI + 0x24);
    anon_unknown.dwarf_8f94::UString::UString
              ((UString *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8,iVar5,(int)in_stack_fffffffffffff9c0);
    pAVar8 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_480);
    al_draw_ustr((int)local_468,(int)uStack_460,(float)(int)lVar3,(float)iVar6,pAVar2,0,pAVar8);
  }
  else {
    local_484 = (int)in_RDI[4];
    if (0 < *(int *)((long)in_RDI + 0x44)) {
      anon_unknown.dwarf_8f94::UString::UString
                ((UString *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 in_stack_fffffffffffff9c8,iVar5,(int)in_stack_fffffffffffff9c0);
      pAVar2 = local_10->font;
      local_4b8._0_4_ = (local_10->fg).r;
      local_4b8._4_4_ = (local_10->fg).g;
      uStack_4b0._0_4_ = (local_10->fg).b;
      uStack_4b0._4_4_ = (local_10->fg).a;
      lVar3 = in_RDI[4];
      iVar5 = *(int *)((long)in_RDI + 0x24);
      pAVar8 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_4a0);
      al_draw_ustr((int)local_4b8,(int)uStack_4b0,(float)(int)lVar3,(float)iVar5,pAVar2,0,pAVar8);
      pAVar2 = local_10->font;
      pAVar8 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_4a0);
      iVar5 = al_get_ustr_width(pAVar2,pAVar8);
      local_484 = iVar5 + local_484;
    }
    uVar1 = *(uint *)((long)in_RDI + 0x44);
    uVar9 = al_ustr_size(in_RDI[7]);
    if (uVar1 == uVar9) {
      fVar11 = (float)local_484;
      iVar5 = *(int *)((long)in_RDI + 0x24);
      iVar6 = local_484 + 8;
      iVar7 = al_get_font_line_height(local_10->font);
      local_4c8._0_4_ = (local_10->fg).r;
      local_4c8._4_4_ = (local_10->fg).g;
      uStack_4c0._0_4_ = (local_10->fg).b;
      uStack_4c0._4_4_ = (local_10->fg).a;
      al_draw_filled_rectangle
                (fVar11,(float)iVar5,(float)iVar6,(float)(iVar5 + iVar7),(undefined4)local_4c8,
                 uStack_4c0);
    }
    else {
      local_4cc = *(undefined4 *)((long)in_RDI + 0x44);
      al_ustr_next(in_RDI[7],&local_4cc);
      anon_unknown.dwarf_8f94::UString::UString
                ((UString *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 in_stack_fffffffffffff9c8,(int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                 (int)in_stack_fffffffffffff9c0);
      pAVar2 = local_10->font;
      pAVar8 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_4e8);
      local_4ec = al_get_ustr_width(pAVar2,pAVar8);
      fVar11 = (float)local_484;
      iVar5 = *(int *)((long)in_RDI + 0x24);
      iVar6 = local_484 + local_4ec;
      iVar7 = al_get_font_line_height(local_10->font);
      local_508._0_4_ = (local_10->fg).r;
      local_508._4_4_ = (local_10->fg).g;
      uStack_500._0_4_ = (local_10->fg).b;
      uStack_500._4_4_ = (local_10->fg).a;
      al_draw_filled_rectangle
                (fVar11,(float)iVar5,(float)iVar6,(float)(iVar5 + iVar7),(undefined4)local_508,
                 uStack_500);
      pAVar2 = local_10->font;
      local_518._0_4_ = (local_10->bg).r;
      local_518._4_4_ = (local_10->bg).g;
      uStack_510._0_4_ = (local_10->bg).b;
      uStack_510._4_4_ = (local_10->bg).a;
      fVar11 = (float)local_484;
      iVar5 = *(int *)((long)in_RDI + 0x24);
      pAVar8 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_4e8);
      al_draw_ustr((int)local_518,(int)uStack_510,fVar11,(float)iVar5,pAVar2,0,pAVar8);
      local_484 = local_484 + local_4ec;
      pAVar8 = (ALLEGRO_USTR *)local_10->font;
      local_528._0_4_ = (local_10->fg).r;
      local_528._4_4_ = (local_10->fg).g;
      uStack_520._0_4_ = (local_10->fg).b;
      uStack_520._4_4_ = (local_10->fg).a;
      fVar11 = (float)local_484;
      fVar12 = (float)*(int *)((long)in_RDI + 0x24);
      anon_unknown.dwarf_8f94::UString::UString
                ((UString *)CONCAT44(fVar12,fVar11),pAVar8,
                 (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),(int)in_stack_fffffffffffff9c0);
      pAVar10 = (anonymous_namespace)::UString::operator_cast_to__al_tagbstring_(local_540);
      al_draw_ustr((int)local_528,(int)uStack_520,fVar11,fVar12,pAVar8,0,pAVar10);
    }
  }
  anon_unknown.dwarf_8f94::SaveState::~SaveState((SaveState *)0x10f588);
  return;
}

Assistant:

void TextEntry::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   if (!focused) {
      al_draw_ustr(theme.font, theme.fg, x1, y1, 0, UString(text, left_pos));
   }
   else {
      int x = x1;

      if (cursor_pos > 0) {
         UString sub(text, left_pos, cursor_pos);
         al_draw_ustr(theme.font, theme.fg, x1, y1, 0, sub);
         x += al_get_ustr_width(theme.font, sub);
      }

      if ((unsigned) cursor_pos == al_ustr_size(text)) {
         al_draw_filled_rectangle(x, y1, x + CURSOR_WIDTH,
            y1 + al_get_font_line_height(theme.font), theme.fg);
      }
      else {
         int post_cursor = cursor_pos;
         al_ustr_next(text, &post_cursor);

         UString sub(text, cursor_pos, post_cursor);
         int subw = al_get_ustr_width(theme.font, sub);
         al_draw_filled_rectangle(x, y1, x + subw,
            y1 + al_get_font_line_height(theme.font), theme.fg);
         al_draw_ustr(theme.font, theme.bg, x, y1, 0, sub);
         x += subw;

         al_draw_ustr(theme.font, theme.fg, x, y1, 0,
            UString(text, post_cursor));
      }
   }
}